

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::item::assign
          (item *this,entry *v,span<const_char> salt,sequence_number seq,public_key *pk,
          secret_key *sk)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  span<const_char> v_00;
  signature local_458;
  array<char,_1000UL> buffer;
  
  iVar4 = bencode<char*>(buffer._M_elems,v);
  v_00.m_len = (long)iVar4;
  v_00.m_ptr = buffer._M_elems;
  sign_mutable_item(&local_458,v_00,salt,seq,pk,sk);
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x30) = local_458.bytes._M_elems._48_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x38) = local_458.bytes._M_elems._56_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x20) = local_458.bytes._M_elems._32_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x28) = local_458.bytes._M_elems._40_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x10) = local_458.bytes._M_elems._16_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x18) = local_458.bytes._M_elems._24_8_;
  *(undefined8 *)(this->m_sig).bytes._M_elems = local_458.bytes._M_elems._0_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 8) = local_458.bytes._M_elems._8_8_;
  ::std::__cxx11::string::assign((char *)&this->m_salt,(ulong)salt.m_ptr);
  uVar1 = *(undefined8 *)((pk->bytes)._M_elems + 8);
  uVar2 = *(undefined8 *)((pk->bytes)._M_elems + 0x10);
  uVar3 = *(undefined8 *)((pk->bytes)._M_elems + 0x18);
  *(undefined8 *)(this->m_pk).bytes._M_elems = *(undefined8 *)(pk->bytes)._M_elems;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 8) = uVar1;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x10) = uVar2;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x18) = uVar3;
  (this->m_seq).value = seq.value;
  this->m_mutable = true;
  entry::operator=(&this->m_value,v);
  return;
}

Assistant:

void item::assign(entry v, span<char const> salt
	, sequence_number const seq, public_key const& pk, secret_key const& sk)
{
	std::array<char, 1000> buffer;
	int const bsize = bencode(buffer.begin(), v);
	TORRENT_ASSERT(bsize <= 1000);
	m_sig = sign_mutable_item(span<char const>(buffer).first(bsize)
		, salt, seq, pk, sk);
	m_salt.assign(salt.data(), static_cast<std::size_t>(salt.size()));
	m_pk = pk;
	m_seq = seq;
	m_mutable = true;
	m_value = std::move(v);
}